

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.cpp
# Opt level: O1

BSSRDFHandle __thiscall
pbrt::SurfaceInteraction::GetBSSRDF
          (SurfaceInteraction *this,RayDifferential *ray,SampledWavelengths *lambda,
          CameraHandle *camera,ScratchBuffer *scratchBuffer)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar11;
  undefined8 uVar10;
  undefined4 uVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  void *pvVar16;
  Interval IVar17;
  ScratchBuffer *in_R9;
  TaggedPointer<pbrt::FloatImageTexture,_pbrt::GPUFloatImageTexture,_pbrt::FloatMixTexture,_pbrt::FloatScaledTexture,_pbrt::FloatConstantTexture,_pbrt::FloatBilerpTexture,_pbrt::FloatCheckerboardTexture,_pbrt::FloatDotsTexture,_pbrt::FBmTexture,_pbrt::FloatPtexTexture,_pbrt::WindyTexture,_pbrt::WrinkledTexture>
  TVar18;
  uintptr_t iptr;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 local_110 [12];
  MaterialHandle local_104;
  Float local_fc;
  undefined8 local_f8;
  undefined4 local_f0;
  undefined8 local_ec;
  undefined1 local_e4 [16];
  undefined4 local_d4;
  undefined8 local_d0;
  undefined4 local_c8;
  undefined8 local_c4;
  float local_bc;
  uintptr_t local_b8;
  undefined4 local_b0;
  undefined8 local_ac;
  float local_a4;
  undefined8 local_a0;
  float fStack_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  Float FStack_8c;
  undefined8 uStack_88;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 uStack_78;
  undefined4 uStack_74;
  undefined8 uStack_70;
  undefined4 uStack_68;
  undefined4 uStack_64;
  undefined8 local_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 uStack_50;
  float local_4c;
  uintptr_t local_48;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 uStack_38;
  float local_34;
  
  TVar18.bits._0_4_ = ray[2].super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
  TVar18.bits._4_4_ = ray[2].super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
  uVar15 = TVar18.bits & 0xffff000000000000;
  if (uVar15 == 0xb000000000000) {
    do {
      auVar19._0_12_ = *(undefined1 (*) [12])&(ray->super_Ray).o;
      auVar19._12_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
      uVar1 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
      uVar3 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
      auVar19 = vinsertps_avx(auVar19,ZEXT416((uint)(ray->super_Ray).d.
                                                    super_Tuple3<pbrt::Vector3,_float>.x),0x10);
      auVar20._0_4_ = (float)uVar1 + auVar19._0_4_;
      auVar20._4_4_ = (float)uVar3 + auVar19._4_4_;
      auVar20._8_4_ = auVar19._8_4_ + 0.0;
      auVar20._12_4_ = auVar19._12_4_ + 0.0;
      auVar13._8_4_ = 0x3f000000;
      auVar13._0_8_ = 0x3f0000003f000000;
      auVar13._12_4_ = 0x3f000000;
      auVar19 = vmulps_avx512vl(auVar20,auVar13);
      fStack_98 = ((ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y +
                  (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z) * 0.5;
      local_a0 = vmovlps_avx(auVar19);
      FStack_8c = ray[2].super_Ray.time;
      uVar8 = ray[2].super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
      uVar11 = ray[2].super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
      uStack_80 = *(undefined4 *)
                   ((long)&ray[2].super_Ray.medium.
                           super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                           .bits + 4);
      uStack_88 = *(undefined8 *)&ray[2].super_Ray.field_0x1c;
      uVar10 = *(undefined8 *)&(ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z;
      uStack_7c = (undefined4)uVar10;
      uStack_78 = (undefined4)((ulong)uVar10 >> 0x20);
      auVar5[0] = ray[2].hasDifferentials;
      auVar5._1_3_ = *(undefined3 *)&ray[2].field_0x29;
      auVar5._4_12_ = *(undefined1 (*) [12])&ray[2].rxOrigin;
      auVar19 = vpermilps_avx(auVar5,0xd8);
      uStack_74 = auVar19._0_4_;
      uStack_70 = auVar19._4_8_;
      uStack_68 = auVar19._12_4_;
      uStack_64 = *(undefined4 *)&ray[1].field_0x5c;
      local_58 = *(undefined4 *)
                  ((long)&(ray->super_Ray).medium.
                          super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                          .bits + 4);
      local_60 = *(undefined8 *)&(ray->super_Ray).field_0x1c;
      local_4c = (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
      uVar10._0_1_ = ray->hasDifferentials;
      uVar10._1_3_ = *(undefined3 *)&ray->field_0x29;
      uVar10._4_4_ = (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x;
      local_54 = (undefined4)uVar10;
      local_40 = *(undefined4 *)&ray[1].hasDifferentials;
      local_48 = ray[1].super_Ray.medium.
                 super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 .bits;
      local_34 = ray[1].rxOrigin.super_Tuple3<pbrt::Point3,_float>.z;
      uVar9 = ray[1].rxOrigin.super_Tuple3<pbrt::Point3,_float>.x;
      uVar12 = ray[1].rxOrigin.super_Tuple3<pbrt::Point3,_float>.y;
      uStack_94 = uVar8;
      uStack_90 = uVar11;
      uStack_50 = uVar10._4_4_;
      local_3c = uVar9;
      uStack_38 = uVar12;
      MixMaterial::ChooseMaterial<pbrt::UniversalTextureEvaluator>
                ((MixMaterial *)local_110,TVar18.bits & 0xffffffffffff);
      ray[2].super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_110._0_4_;
      ray[2].super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_110._4_4_;
      uVar15 = local_110._0_8_ & 0xffff000000000000;
      TVar18.bits = local_110._0_8_;
    } while (uVar15 == 0xb000000000000);
  }
  auVar6._0_12_ = *(undefined1 (*) [12])&(ray->super_Ray).o;
  auVar6._12_4_ = (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.x;
  uVar2 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.y;
  uVar4 = (ray->super_Ray).o.super_Tuple3<pbrt::Point3,_float>.z;
  auVar19 = vinsertps_avx(auVar6,ZEXT416((uint)(ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>
                                               .x),0x10);
  auVar21._0_4_ = (float)uVar2 + auVar19._0_4_;
  auVar21._4_4_ = (float)uVar4 + auVar19._4_4_;
  auVar21._8_4_ = auVar19._8_4_ + 0.0;
  auVar21._12_4_ = auVar19._12_4_ + 0.0;
  auVar14._8_4_ = 0x3f000000;
  auVar14._0_8_ = 0x3f0000003f000000;
  auVar14._12_4_ = 0x3f000000;
  auVar19 = vmulps_avx512vl(auVar21,auVar14);
  local_110._8_4_ =
       ((ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.y +
       (ray->super_Ray).d.super_Tuple3<pbrt::Vector3,_float>.z) * 0.5;
  local_f0 = *(undefined4 *)
              ((long)&ray[2].super_Ray.medium.
                      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                      .bits + 4);
  local_f8 = *(undefined8 *)&ray[2].super_Ray.field_0x1c;
  local_ec = *(undefined8 *)&(ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.z;
  local_d4 = *(undefined4 *)&ray[1].field_0x5c;
  local_c8 = *(undefined4 *)
              ((long)&(ray->super_Ray).medium.
                      super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                      .bits + 4);
  local_d0 = *(undefined8 *)&(ray->super_Ray).field_0x1c;
  local_b0 = *(undefined4 *)&ray[1].hasDifferentials;
  local_b8 = ray[1].super_Ray.medium.
             super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
             .bits;
  local_110._0_8_ = vmovlps_avx(auVar19);
  local_104.
  super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
  .bits = *(TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
            *)&ray[2].super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
  local_fc = ray[2].super_Ray.time;
  auVar7[0] = ray[2].hasDifferentials;
  auVar7._1_3_ = *(undefined3 *)&ray[2].field_0x29;
  auVar7._4_12_ = *(undefined1 (*) [12])&ray[2].rxOrigin;
  local_e4 = vpermilps_avx(auVar7,0xd8);
  local_c4._0_1_ = ray->hasDifferentials;
  local_c4._1_3_ = *(undefined3 *)&ray->field_0x29;
  local_c4._4_4_ = (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.x;
  local_bc = (ray->rxOrigin).super_Tuple3<pbrt::Point3,_float>.y;
  local_ac._0_4_ = ray[1].rxOrigin.super_Tuple3<pbrt::Point3,_float>.x;
  local_ac._4_4_ = ray[1].rxOrigin.super_Tuple3<pbrt::Point3,_float>.y;
  local_a4 = ray[1].rxOrigin.super_Tuple3<pbrt::Point3,_float>.z;
  if (uVar15 == 0x9000000000000) {
    pvVar16 = ScratchBuffer::Alloc(in_R9,0x50,8);
    SubsurfaceMaterial::GetBSSRDF<pbrt::UniversalTextureEvaluator>
              ((SubsurfaceMaterial *)(TVar18.bits & 0xffffffffffff),local_110,camera,pvVar16);
    IVar17 = (Interval)((ulong)pvVar16 | 0x1000000000000);
  }
  else {
    IVar17.low = 0.0;
    IVar17.high = 0.0;
  }
  (this->super_Interaction).pi.super_Point3<pbrt::Interval>.
  super_Tuple3<pbrt::Point3,_pbrt::Interval>.x = IVar17;
  return (BSSRDFHandle)(TaggedPointer<pbrt::TabulatedBSSRDF>)this;
}

Assistant:

BSSRDFHandle SurfaceInteraction::GetBSSRDF(const RayDifferential &ray,
                                           SampledWavelengths &lambda,
                                           CameraHandle camera,
                                           ScratchBuffer &scratchBuffer) {
    // Resolve _MixMaterial_ if necessary
    while (material.Is<MixMaterial>()) {
        MixMaterial *mix = material.CastOrNullptr<MixMaterial>();
        material = mix->ChooseMaterial(UniversalTextureEvaluator(), *this);
    }

    return material.GetBSSRDF(UniversalTextureEvaluator(), *this, lambda, scratchBuffer);
}